

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int compare_socket_address(sockaddr *x,sockaddr *y)

{
  ulong uVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  ushort uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar2 = x->sa_family;
  if (uVar2 != y->sa_family) {
    bVar8 = uVar2 < y->sa_family;
    goto LAB_0012738f;
  }
  if (uVar2 == 0) {
    return 1;
  }
  if (uVar2 == 10) {
    uVar7 = *(ulong *)(x->sa_data + 6);
    uVar4 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
            (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
            (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
    uVar7 = *(ulong *)(y->sa_data + 6);
    uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
            (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
            (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
    if (uVar4 == uVar7) {
      uVar7._0_2_ = x[1].sa_family;
      uVar7._2_1_ = x[1].sa_data[0];
      uVar7._3_1_ = x[1].sa_data[1];
      uVar7._4_1_ = x[1].sa_data[2];
      uVar7._5_1_ = x[1].sa_data[3];
      uVar7._6_1_ = x[1].sa_data[4];
      uVar7._7_1_ = x[1].sa_data[5];
      uVar1._0_2_ = y[1].sa_family;
      uVar1._2_1_ = y[1].sa_data[0];
      uVar1._3_1_ = y[1].sa_data[1];
      uVar1._4_1_ = y[1].sa_data[2];
      uVar1._5_1_ = y[1].sa_data[3];
      uVar1._6_1_ = y[1].sa_data[4];
      uVar1._7_1_ = y[1].sa_data[5];
      uVar4 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18
              | (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18
              | (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
      uVar7 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
              | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18
              | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      uVar3 = 0;
      if (uVar4 != uVar7) goto LAB_001273bd;
    }
    else {
LAB_001273bd:
      uVar3 = -(uint)(uVar4 < uVar7) | 1;
    }
    if (uVar3 != 0) {
      return uVar3;
    }
    uVar2 = *(ushort *)x->sa_data;
    uVar5 = *(ushort *)y->sa_data;
    if (uVar2 == uVar5) {
      uVar3 = *(uint *)(x->sa_data + 2);
      uVar6 = *(uint *)(y->sa_data + 2);
      if (uVar3 == uVar6) {
        uVar3 = *(uint *)(x[1].sa_data + 6);
        uVar6 = *(uint *)(y[1].sa_data + 6);
        if (uVar3 == uVar6) {
          return 0;
        }
      }
      goto LAB_001273d6;
    }
  }
  else {
    if (uVar2 != 2) {
      __assert_fail("!\"unknown sa_family\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                    ,0x13f3,"int compare_socket_address(struct sockaddr *, struct sockaddr *)");
    }
    uVar3 = *(uint *)(x->sa_data + 2);
    uVar6 = *(uint *)(y->sa_data + 2);
    if (uVar3 != uVar6) {
      uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
LAB_001273d6:
      bVar8 = uVar3 < uVar6;
      goto LAB_0012738f;
    }
    uVar2 = *(ushort *)x->sa_data;
    uVar5 = *(ushort *)y->sa_data;
    if (uVar2 == uVar5) {
      return 0;
    }
  }
  bVar8 = (ushort)(uVar2 << 8 | uVar2 >> 8) < (ushort)(uVar5 << 8 | uVar5 >> 8);
LAB_0012738f:
  return -(uint)bVar8 | 1;
}

Assistant:

static int compare_socket_address(struct sockaddr *x, struct sockaddr *y)
{
#define CMP(a, b)                                                                                                                  \
    if (a != b)                                                                                                                    \
    return a < b ? -1 : 1

    CMP(x->sa_family, y->sa_family);

    if (x->sa_family == AF_INET) {
        struct sockaddr_in *xin = (void *)x, *yin = (void *)y;
        CMP(ntohl(xin->sin_addr.s_addr), ntohl(yin->sin_addr.s_addr));
        CMP(ntohs(xin->sin_port), ntohs(yin->sin_port));
    } else if (x->sa_family == AF_INET6) {
        struct sockaddr_in6 *xin6 = (void *)x, *yin6 = (void *)y;
        int r = memcmp(xin6->sin6_addr.s6_addr, yin6->sin6_addr.s6_addr, sizeof(xin6->sin6_addr.s6_addr));
        if (r != 0)
            return r;
        CMP(ntohs(xin6->sin6_port), ntohs(yin6->sin6_port));
        CMP(xin6->sin6_flowinfo, yin6->sin6_flowinfo);
        CMP(xin6->sin6_scope_id, yin6->sin6_scope_id);
    } else if (x->sa_family == AF_UNSPEC) {
        return 1;
    } else {
        assert(!"unknown sa_family");
    }

#undef CMP
    return 0;
}